

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::~Player(Player *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  Hand *this_01;
  DiceRoller *this_02;
  list<Observer_*,_std::allocator<Observer_*>_> *this_03;
  Player *this_local;
  
  this_00 = this->pOwnedCountries;
  if (this_00 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::~vector(this_00);
    operator_delete(this_00,0x18);
  }
  this_01 = this->pCards;
  if (this_01 != (Hand *)0x0) {
    Hand::~Hand(this_01);
    operator_delete(this_01,8);
  }
  this_02 = this->pDiceRoller;
  if (this_02 != (DiceRoller *)0x0) {
    DiceRoller::~DiceRoller(this_02);
    operator_delete(this_02,0x10);
  }
  if (this->pPlayerId != (int *)0x0) {
    operator_delete(this->pPlayerId,4);
  }
  this_03 = this->pObservers;
  if (this_03 != (list<Observer_*,_std::allocator<Observer_*>_> *)0x0) {
    std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::~list(this_03);
    operator_delete(this_03,0x18);
  }
  if (this->currentState != (PlayerState *)0x0) {
    operator_delete(this->currentState,4);
  }
  if (this->strategy != (PlayerStrategy *)0x0) {
    (*this->strategy->_vptr_PlayerStrategy[7])();
  }
  return;
}

Assistant:

Player::~Player() {
    delete pOwnedCountries;
    delete pCards;
    delete pDiceRoller;
    delete pPlayerId;
    delete pObservers;
    delete currentState;
    delete strategy;
}